

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int gpio_trigger(uint user_gpio,uint pulseLen,uint32_t level)

{
  int iVar1;
  gpioExtent_t *unaff_retaddr;
  int in_stack_00000008;
  gpioExtent_t ext [1];
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  undefined1 local_c [12];
  
  iVar1 = pigpio_command_ext(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,
                             in_stack_ffffffffffffffe8,(int)((ulong)local_c >> 0x20),(int)local_c,0,
                             unaff_retaddr,in_stack_00000008);
  return iVar1;
}

Assistant:

int gpio_trigger(unsigned user_gpio, unsigned pulseLen, uint32_t level)
{
   gpioExtent_t ext[1];
   
   /*
   p1=user_gpio
   p2=pulseLen
   p3=4
   ## extension ##
   unsigned level
   */

   ext[0].size = sizeof(uint32_t);
   ext[0].ptr = &level;

   return pigpio_command_ext(
      gPigCommand, PI_CMD_TRIG, user_gpio, pulseLen, 4, 1, ext, 1);
}